

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas2_d.cpp
# Opt level: O2

void dger(int m,int n,double alpha,double *x,int incx,double *y,int incy,double *a,int lda)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  string local_68;
  double local_48;
  double *local_40;
  allocator<char> local_31;
  
  local_40 = y;
  if (m < 0) {
    iVar2 = 1;
  }
  else if (n < 0) {
    iVar2 = 2;
  }
  else if (incx == 0) {
    iVar2 = 5;
  }
  else if (incy == 0) {
    iVar2 = 7;
  }
  else {
    local_48 = alpha;
    iVar2 = i4_max(1,m);
    if (iVar2 <= lda) {
      if (m == 0) {
        return;
      }
      if (n == 0) {
        return;
      }
      if ((local_48 == 0.0) && (!NAN(local_48))) {
        return;
      }
      uVar6 = 0;
      iVar2 = (1 - n) * incy;
      if (0 < incy) {
        iVar2 = 0;
      }
      if (incx == 1) {
        lVar4 = (long)iVar2;
        for (uVar6 = 0; uVar6 != (uint)n; uVar6 = uVar6 + 1) {
          dVar1 = local_40[lVar4];
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            for (uVar7 = 0; (uint)m != uVar7; uVar7 = uVar7 + 1) {
              a[uVar7] = x[uVar7] * dVar1 * local_48 + a[uVar7];
            }
          }
          lVar4 = lVar4 + incy;
          a = a + lda;
        }
        return;
      }
      iVar3 = (1 - m) * incx;
      if (0 < incx) {
        iVar3 = 0;
      }
      lVar4 = (long)iVar2;
      for (; uVar6 != (uint)n; uVar6 = uVar6 + 1) {
        dVar1 = local_40[lVar4];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          pdVar5 = x + iVar3;
          for (uVar7 = 0; (uint)m != uVar7; uVar7 = uVar7 + 1) {
            a[uVar7] = *pdVar5 * dVar1 * local_48 + a[uVar7];
            pdVar5 = pdVar5 + incx;
          }
        }
        lVar4 = lVar4 + incy;
        a = a + lda;
      }
      return;
    }
    iVar2 = 9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"DGER",&local_31);
  xerbla(&local_68,iVar2);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void dger ( int m, int n, double alpha, double x[], int incx, double y[], 
  int incy, double a[], int lda )

//****************************************************************************80
//
//  Purpose:
//
//    DGER computes A := alpha*x*y' + A.
//
//  Discussion:
//
//    DGER performs the rank 1 operation
//
//      A := alpha*x*y' + A,
//
//    where alpha is a scalar, x is an m element vector, y is an n element
//    vector and A is an m by n matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    04 April 2014
//
//  Author:
//
//    Original FORTRAN77 version by Jack Dongarra,  Jeremy Du Croz,  
//    Sven Hammarling,  Richard Hanson.
//    This C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, int M, the number of rows of the matrix A.
//    0 <= M.
//
//    Input, int N, the number of columns of the matrix A.
//    0 <= N.
//
//    Input, double ALPHA, the scalar multiplier.
//
//    Input, double X[1+(M-1)*abs(INCX)], the first vector.
//
//    Input, int INCX, the increment for elements of X.
//    INCX must not be zero.
//
//    Input, double Y[1+(N-1)*abs(INCY)], the second vector.
//
//    Input, int INCY, the increment for elements of Y.
//    INCY must not be zero.
//
//    Input/output, double A[LDA*N].  On entry, the leading M by N 
//    part of the array contains the matrix of coefficients. On exit, A is
//    overwritten by the updated matrix.
//
//    Input, int LDA, the first dimension of A as declared
//    in the calling program. max ( 1, M ) <= LDA.
//
{
  int i;
  int info;
  int ix;
  int j;
  int jy;
  int kx;
  double temp;
//
//  Test the input parameters.
//
  info = 0;
  if ( m < 0 )
  {
    info = 1;
  }
  else if ( n < 0 )
  {
    info = 2;
  }
  else if ( incx == 0 )
  {
    info = 5;
  }
  else if ( incy == 0 )
  {
    info = 7;
  }
  else if ( lda < i4_max ( 1, m ) )
  {
    info = 9;
  }

  if ( info != 0 )
  {
    xerbla ( "DGER", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( m == 0 || n == 0 || alpha == 0.0 )
  {
    return;
  }
//
//  Start the operations. In this version the elements of A are
//  accessed sequentially with one pass through A.
//
  if ( 0 < incy )
  {
    jy = 0;
  }
  else
  {
    jy = 0 - ( n - 1 ) * incy;
  }

  if ( incx == 1 )
  {
    for ( j = 0; j < n; j++ )
    {
      if ( y[jy] != 0.0 )
      {
        temp = alpha * y[jy];
        for ( i = 0; i < m; i++ )
        {
          a[i+j*lda] = a[i+j*lda] + x[i] * temp;
        }
      }
      jy = jy + incy;
    }
  }
  else
  {
    if ( 0 < incx )
    {
      kx = 0;
    }
    else
    {
      kx = 0 - ( m - 1 ) * incx;
    }
    for ( j = 0; j < n; j++ )
    {
      if ( y[jy] != 0.0 )
      {
        temp = alpha * y[jy];
        ix = kx;
        for ( i = 0; i < m; i++ )
        {
          a[i+j*lda] = a[i+j*lda] + x[ix] * temp;
          ix = ix + incx;
        }
      }
      jy = jy + incy;
    }
  }

  return;
}